

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::bindRenderbuffer(ReferenceContext *this,deUint32 target,deUint32 name)

{
  int *piVar1;
  ObjectManager<sglr::rc::Renderbuffer> *this_00;
  Renderbuffer *pRVar2;
  pair<unsigned_int,_sglr::rc::Renderbuffer_*> local_30;
  
  if (target == 0x8d41) {
    if (name == 0) {
      pRVar2 = (Renderbuffer *)0x0;
    }
    else {
      this_00 = &this->m_renderbuffers;
      pRVar2 = rc::ObjectManager<sglr::rc::Renderbuffer>::find(this_00,name);
      if (pRVar2 == (Renderbuffer *)0x0) {
        pRVar2 = (Renderbuffer *)operator_new(0x38);
        (pRVar2->super_NamedObject).m_name = name;
        (pRVar2->super_NamedObject).m_refCount = 1;
        (pRVar2->super_NamedObject)._vptr_NamedObject = (_func_int **)&PTR__Renderbuffer_00b6d980;
        tcu::TextureLevel::TextureLevel(&pRVar2->m_data);
        local_30.first = (pRVar2->super_NamedObject).m_name;
        if (this_00->m_lastName < local_30.first) {
          this_00->m_lastName = local_30.first;
        }
        local_30.second = pRVar2;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>>>
        ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::Renderbuffer*>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Renderbuffer*>>>
                    *)&(this->m_renderbuffers).m_objects,&local_30);
      }
    }
    if (this->m_renderbufferBinding != (Renderbuffer *)0x0) {
      rc::ObjectManager<sglr::rc::Renderbuffer>::releaseReference
                (&this->m_renderbuffers,this->m_renderbufferBinding);
    }
    if (pRVar2 != (Renderbuffer *)0x0) {
      piVar1 = &(pRVar2->super_NamedObject).m_refCount;
      *piVar1 = *piVar1 + 1;
    }
    this->m_renderbufferBinding = pRVar2;
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::bindRenderbuffer (deUint32 target, deUint32 name)
{
	Renderbuffer* rbo = DE_NULL;

	RC_IF_ERROR(target != GL_RENDERBUFFER, GL_INVALID_ENUM, RC_RET_VOID);

	if (name != 0)
	{
		rbo = m_renderbuffers.find(name);
		if (!rbo)
		{
			rbo = new Renderbuffer(name);
			m_renderbuffers.insert(rbo);
		}
	}

	// Remove old reference
	if (m_renderbufferBinding)
		m_renderbuffers.releaseReference(m_renderbufferBinding);

	// Create new reference
	if (rbo)
		m_renderbuffers.acquireReference(rbo);

	m_renderbufferBinding = rbo;
}